

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

void __thiscall
dg::dda::MemorySSATransformation::fillDefinitionsFromCall
          (MemorySSATransformation *this,Definitions *D,RWNodeCall *C,DefSite *ds)

{
  ulong uVar1;
  size_t *psVar2;
  ulong uVar3;
  ulong uVar4;
  RWBBlock *pRVar5;
  pointer pRVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  RWNode *n;
  _List_node_base *p_Var10;
  pointer pDVar11;
  RWCalledValue *callee;
  pointer pRVar12;
  DefSite uncoveredds;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  uncovered;
  DefSite local_60;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_48;
  
  bVar8 = callMayDefineTarget(this,C,ds->target);
  if (bVar8) {
    DefinitionsMap<dg::dda::RWNode>::undefinedIntervals(&local_48,&D->kills,ds);
    uVar7 = Offset::UNKNOWN;
    if (local_48.
        super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar1 = Offset::UNKNOWN - 1;
      pDVar11 = local_48.
                super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar3 = (pDVar11->end).offset;
        uVar9 = uVar7;
        if (uVar3 != uVar7) {
          uVar4 = (pDVar11->start).offset;
          uVar9 = uVar3 - uVar4;
          if (uVar3 < uVar4) {
            uVar9 = uVar7;
          }
          if (uVar4 == uVar7) {
            uVar9 = uVar7;
          }
        }
        local_60.len.offset = uVar9 + 1;
        if (uVar1 <= uVar9) {
          local_60.len.offset = uVar7;
        }
        local_60.target = ds->target;
        if (uVar9 == uVar7) {
          local_60.len.offset = uVar7;
        }
        local_60.offset.offset = (pDVar11->start).offset;
        n = createPhi(this,D,&local_60,CALLOUT);
        pRVar5 = (C->super_RWNode).bblock;
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = (_List_node_base *)n;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        psVar2 = &(pRVar5->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                  super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                  _M_node._M_size;
        *psVar2 = *psVar2 + 1;
        n->bblock = pRVar5;
        RWNodeCall::addOutput(C,n);
        pRVar6 = (C->callees).
                 super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pRVar12 = (C->callees).
                       super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>
                       ._M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar6;
            pRVar12 = pRVar12 + 1) {
          if (pRVar12->subgraph == (RWSubgraph *)0x0) {
            addDefinitionsFromCalledValue(this,n,C,&local_60,pRVar12->calledValue);
          }
          else {
            findDefinitionsInSubgraph(this,n,C,&local_60,pRVar12->subgraph);
          }
        }
        pDVar11 = pDVar11 + 1;
      } while (pDVar11 !=
               local_48.
               super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.
        super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void MemorySSATransformation::fillDefinitionsFromCall(Definitions &D,
                                                      RWNodeCall *C,
                                                      const DefSite &ds) {
    if (!callMayDefineTarget(C, ds.target))
        return;

    // find the uncovered parts of the sought definition
    auto uncovered = D.uncovered(ds);
    for (auto &interval : uncovered) {
        auto uncoveredds =
                DefSite{ds.target, interval.start, interval.length()};
        // this phi will merge the definitions from all the
        // possibly called subgraphs
        auto *phi = createPhi(D, uncoveredds, RWNodeType::CALLOUT);
        C->getBBlock()->append(phi);
        C->addOutput(phi);

        // recursively find definitions for this phi node
        for (auto &callee : C->getCallees()) {
            if (auto *subg = callee.getSubgraph()) {
                findDefinitionsInSubgraph(phi, C, uncoveredds, subg);
            } else {
                addDefinitionsFromCalledValue(phi, C, uncoveredds,
                                              callee.getCalledValue());
            }
        }
    }
}